

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mipsdsp_append(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,uint32_t op1,int rt,
                       int rs,int sa)

{
  TCGContext_conflict6 *s;
  TCGTemp *a1;
  uint uVar1;
  TCGv_i64 pTVar2;
  TCGTemp *a2;
  TCGTemp *a1_00;
  TCGOpcode opc;
  uintptr_t o_1;
  TCGv_i64 ret;
  
  s = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
  if ((*(byte *)((long)(env->active_tc).gpr + 0x62) & 0x10) == 0) {
    gen_mipsdsp_append_cold_1();
  }
  if (op1 == 0) {
    return;
  }
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  if (rt == 0) {
    opc = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_009be3cf:
    tcg_gen_op2_mips64el(s,opc,(TCGArg)a1,(TCGArg)pTVar2);
  }
  else if (s->cpu_gpr[rt] != ret) {
    pTVar2 = s->cpu_gpr[rt] + (long)s;
    opc = INDEX_op_mov_i64;
    goto LAB_009be3cf;
  }
  if ((int)ctx == 0x7c000035) {
    uVar1 = (uint)(env->active_tc).gpr[7] & 0xfc0007ff;
    if ((int)uVar1 < 0x7c0000f5) {
      if (uVar1 == 0x7c000035) {
        if (rs != 0) {
          tcg_gen_deposit_i64_mips64el(s,s->cpu_gpr[op1],ret,s->cpu_gpr[op1],rs,0x40 - rs);
        }
        goto LAB_009be6d5;
      }
      if (uVar1 != 0x7c000075) {
LAB_009be55e:
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        goto LAB_009be6d5;
      }
      if (rs == 0) goto LAB_009be6d5;
      tcg_gen_shri_i64_mips64el(s,s->cpu_gpr[op1],s->cpu_gpr[op1],(ulong)(uint)rs);
      tcg_gen_shli_i64_mips64el(s,ret,ret,(ulong)(0x40 - rs));
      a1_00 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[op1]);
      a2 = a1_00;
    }
    else if (uVar1 == 0x7c0000f5) {
      tcg_gen_shri_i64_mips64el(s,s->cpu_gpr[op1],s->cpu_gpr[op1],(ulong)(rs | 0x20U));
      tcg_gen_shli_i64_mips64el(s,ret,ret,(ulong)(0x40 - (rs | 0x20U)));
      a1_00 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[op1]);
      a2 = a1;
    }
    else {
      if (uVar1 != 0x7c000435) goto LAB_009be55e;
      uVar1 = rs & 7;
      if (uVar1 == 4 || (rs & 5U) == 0) goto LAB_009be6d5;
      tcg_gen_shli_i64_mips64el(s,s->cpu_gpr[op1],s->cpu_gpr[op1],(ulong)(uVar1 * 8));
      tcg_gen_shri_i64_mips64el(s,ret,ret,(ulong)(uVar1 * -8 + 0x40));
      a1_00 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[op1]);
      a2 = a1_00;
    }
    tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)a1_00,(TCGArg)a2,(TCGArg)a1);
    goto LAB_009be6d5;
  }
  if ((int)ctx != 0x7c000031) goto LAB_009be6d5;
  uVar1 = (uint)(env->active_tc).gpr[7] & 0xfc0007ff;
  if (uVar1 == 0x7c000431) {
    if ((rs & 1U) != 0) {
      tcg_gen_shli_i64_mips64el(s,s->cpu_gpr[op1],s->cpu_gpr[op1],(ulong)((rs & 3U) * 8));
      tcg_gen_ext32u_i64_mips64el(s,ret,ret);
      tcg_gen_shri_i64_mips64el(s,ret,ret,(ulong)((rs & 3U) * -8 + 0x20));
LAB_009be618:
      pTVar2 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[op1]);
      tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)a1);
    }
LAB_009be636:
    pTVar2 = s->cpu_gpr[op1];
  }
  else {
    if (uVar1 == 0x7c000071) {
      if (rs != 0) {
        tcg_gen_ext32u_i64_mips64el(s,s->cpu_gpr[op1],s->cpu_gpr[op1]);
        tcg_gen_shri_i64_mips64el(s,s->cpu_gpr[op1],s->cpu_gpr[op1],(ulong)(uint)rs);
        tcg_gen_shli_i64_mips64el(s,ret,ret,(ulong)(0x20 - rs));
        goto LAB_009be618;
      }
      goto LAB_009be636;
    }
    if (uVar1 != 0x7c000031) goto LAB_009be55e;
    if (rs != 0) {
      tcg_gen_deposit_i64_mips64el(s,s->cpu_gpr[op1],ret,s->cpu_gpr[op1],rs,0x20 - rs);
    }
    pTVar2 = s->cpu_gpr[op1];
  }
  tcg_gen_ext32s_i64_mips64el(s,pTVar2,pTVar2);
LAB_009be6d5:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_mipsdsp_append(CPUMIPSState *env, DisasContext *ctx,
                               uint32_t op1, int rt, int rs, int sa)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    check_dsp_r2(ctx);

    if (rt == 0) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);

    switch (op1) {
    case OPC_APPEND_DSP:
        switch (MASK_APPEND(ctx->opcode)) {
        case OPC_APPEND:
            if (sa != 0) {
                tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, tcg_ctx->cpu_gpr[rt], sa, 32 - sa);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        case OPC_PREPEND:
            if (sa != 0) {
                tcg_gen_ext32u_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
                tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], sa);
                tcg_gen_shli_tl(tcg_ctx, t0, t0, 32 - sa);
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        case OPC_BALIGN:
            sa &= 3;
            if (sa != 0 && sa != 2) {
                tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 8 * sa);
                tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
                tcg_gen_shri_tl(tcg_ctx, t0, t0, 8 * (4 - sa));
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        default:            /* Invalid */
            MIPS_INVAL("MASK APPEND");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DAPPEND_DSP:
        switch (MASK_DAPPEND(ctx->opcode)) {
        case OPC_DAPPEND:
            if (sa != 0) {
                tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, tcg_ctx->cpu_gpr[rt], sa, 64 - sa);
            }
            break;
        case OPC_PREPENDD:
            tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 0x20 | sa);
            tcg_gen_shli_tl(tcg_ctx, t0, t0, 64 - (0x20 | sa));
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, t0);
            break;
        case OPC_PREPENDW:
            if (sa != 0) {
                tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], sa);
                tcg_gen_shli_tl(tcg_ctx, t0, t0, 64 - sa);
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            break;
        case OPC_DBALIGN:
            sa &= 7;
            if (sa != 0 && sa != 2 && sa != 4) {
                tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 8 * sa);
                tcg_gen_shri_tl(tcg_ctx, t0, t0, 8 * (8 - sa));
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            break;
        default:            /* Invalid */
            MIPS_INVAL("MASK DAPPEND");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}